

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O0

int Lpk_FunSuppMinimize(Lpk_Fun_t *p)

{
  uint uVar1;
  uint uVar2;
  uint *pOut;
  uint *pIn;
  uint local_20;
  int nVarsNew;
  int k;
  int i;
  Lpk_Fun_t *p_local;
  
  uVar2 = p->uSupp;
  uVar1 = Kit_BitMask(*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar2 == uVar1) {
    p_local._4_4_ = 0;
  }
  else {
    *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xbfffffff;
    uVar2 = Kit_WordCountOnes(p->uSupp);
    pOut = Lpk_FunTruth(p,1);
    pIn = Lpk_FunTruth(p,0);
    Kit_TruthShrink(pOut,pIn,uVar2,*(uint *)&p->field_0x8 >> 7 & 0x1f,p->uSupp,1);
    local_20 = 0;
    for (nVarsNew = 0; nVarsNew < 0x10; nVarsNew = nVarsNew + 1) {
      if ((p->uSupp & 1 << ((byte)nVarsNew & 0x1f)) != 0) {
        p->pFanins[(int)local_20] = p->pFanins[nVarsNew];
        p->pDelays[(int)local_20] = p->pDelays[nVarsNew];
        local_20 = local_20 + 1;
      }
    }
    if (local_20 != uVar2) {
      __assert_fail("k == nVarsNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcUtil.c"
                    ,0xa9,"int Lpk_FunSuppMinimize(Lpk_Fun_t *)");
    }
    *(uint *)&p->field_0x8 = *(uint *)&p->field_0x8 & 0xfffff07f | (local_20 & 0x1f) << 7;
    uVar2 = Kit_BitMask(*(uint *)&p->field_0x8 >> 7 & 0x1f);
    p->uSupp = uVar2;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Lpk_FunSuppMinimize( Lpk_Fun_t * p )
{
    int i, k, nVarsNew;
    // compress the truth table
    if ( p->uSupp == Kit_BitMask(p->nVars) )
        return 0;
    // invalidate support info
    p->fSupports = 0;
//Extra_PrintBinary( stdout, &p->uSupp, p->nVars ); printf( "\n" );
    // minimize support
    nVarsNew = Kit_WordCountOnes(p->uSupp);
    Kit_TruthShrink( Lpk_FunTruth(p, 1), Lpk_FunTruth(p, 0), nVarsNew, p->nVars, p->uSupp, 1 );
    k = 0;
    Lpk_SuppForEachVar( p->uSupp, i )
    {
        p->pFanins[k] = p->pFanins[i];
        p->pDelays[k] = p->pDelays[i];
/*
        if ( p->fSupports )
        {
            p->puSupps[2*k+0] = p->puSupps[2*i+0];
            p->puSupps[2*k+1] = p->puSupps[2*i+1];
        }
*/
        k++;
    }
    assert( k == nVarsNew );
    p->nVars = k;
    p->uSupp = Kit_BitMask(p->nVars);
    return 1;
}